

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O2

void update_dispatch_table_for_class(Class cls)

{
  if (update_dispatch_table_for_class_warned == '\0') {
    fprintf(_stderr,"Warning: Calling deprecated private ObjC runtime function %s\n",
            "update_dispatch_table_for_class");
    update_dispatch_table_for_class_warned = '\x01';
  }
  objc_update_dtable_for_class(cls);
  return;
}

Assistant:

LEGACY void update_dispatch_table_for_class(Class cls)
{
	static BOOL warned = NO;
	if (!warned)
	{
		fprintf(stderr, 
			"Warning: Calling deprecated private ObjC runtime function %s\n", __func__);
		warned = YES;
	}
	objc_update_dtable_for_class(cls);
}